

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

ZSTD_DDict * ZSTD_DDictHashSet_getDDict(ZSTD_DDictHashSet *hashSet,U32 dictID)

{
  size_t sVar1;
  uint uVar2;
  size_t currDictID;
  size_t idxRangeMask;
  size_t idx;
  U32 dictID_local;
  ZSTD_DDictHashSet *hashSet_local;
  
  idxRangeMask = ZSTD_DDictHashSet_getIndex(hashSet,dictID);
  sVar1 = hashSet->ddictPtrTableSize;
  while( true ) {
    uVar2 = ZSTD_getDictID_fromDDict(hashSet->ddictPtrTable[idxRangeMask]);
    if ((uVar2 == dictID) || (uVar2 == 0)) break;
    idxRangeMask = (sVar1 - 1 & idxRangeMask) + 1;
  }
  return hashSet->ddictPtrTable[idxRangeMask];
}

Assistant:

static const ZSTD_DDict* ZSTD_DDictHashSet_getDDict(ZSTD_DDictHashSet* hashSet, U32 dictID) {
    size_t idx = ZSTD_DDictHashSet_getIndex(hashSet, dictID);
    const size_t idxRangeMask = hashSet->ddictPtrTableSize - 1;
    DEBUGLOG(4, "Hashed index: for dictID: %u is %zu", dictID, idx);
    for (;;) {
        size_t currDictID = ZSTD_getDictID_fromDDict(hashSet->ddictPtrTable[idx]);
        if (currDictID == dictID || currDictID == 0) {
            /* currDictID == 0 implies a NULL ddict entry */
            break;
        } else {
            idx &= idxRangeMask;    /* Goes to start of table when we reach the end */
            idx++;
        }
    }
    DEBUGLOG(4, "Final idx after probing for dictID %u is: %zu", dictID, idx);
    return hashSet->ddictPtrTable[idx];
}